

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O2

Flow * __thiscall
wasm::ModuleRunnerBase<wasm::ModuleRunner>::visitCallIndirect
          (Flow *__return_storage_ptr__,ModuleRunnerBase<wasm::ModuleRunner> *this,
          CallIndirect *curr)

{
  char **arguments_00;
  ExternalInterface *pEVar1;
  size_t sVar2;
  char *pcVar3;
  char cVar4;
  undefined8 uVar5;
  undefined1 local_158 [8];
  Flow flow;
  Flow target;
  Literals arguments;
  Literal funcref;
  Type local_50;
  undefined1 local_48 [8];
  TableInstanceInfo info;
  
  arguments_00 = &target.breakTo.super_IString.str._M_str;
  target.breakTo.super_IString.str._M_str = (char *)0x0;
  ExpressionRunner<wasm::ModuleRunner>::generateArguments
            ((Flow *)local_158,&this->super_ExpressionRunner<wasm::ModuleRunner>,&curr->operands,
             (Literals *)arguments_00);
  if (flow.breakTo.super_IString.str._M_len == 0) {
    ExpressionRunner<wasm::ModuleRunner>::visit
              ((Flow *)&flow.breakTo.super_IString.str._M_str,
               &this->super_ExpressionRunner<wasm::ModuleRunner>,curr->target);
    if (target.breakTo.super_IString.str._M_len == 0) {
      Flow::getSingleValue((Flow *)&flow.breakTo.super_IString.str._M_str);
      uVar5 = ::wasm::Literal::getUnsigned();
      getTableInstanceInfo((TableInstanceInfo *)local_48,this,(Name)(curr->table).super_IString.str)
      ;
      if (curr->isReturn == true) {
        pEVar1 = ((ModuleRunnerBase<wasm::ModuleRunner> *)local_48)->externalInterface;
        (*pEVar1->_vptr_ExternalInterface[0x1d])
                  (&stack0xffffffffffffff78,pEVar1,info.instance,info.name.super_IString.str._M_len,
                   uVar5);
        Type::Type(&local_50,(HeapType)(curr->heapType).id,NonNullable,Inexact);
        cVar4 = ::wasm::Type::isSubType
                          ((Type)funcref.field_0.gcData.
                                 super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_refcount._M_pi,local_50);
        if (cVar4 == '\0') {
          (*(this->super_ExpressionRunner<wasm::ModuleRunner>)._vptr_ExpressionRunner[2])
                    (this,"cast failure in call_indirect");
        }
        SmallVector<wasm::Literal,_1UL>::push_back
                  ((SmallVector<wasm::Literal,_1UL> *)&target.breakTo.super_IString.str._M_str,
                   (Literal *)&stack0xffffffffffffff78);
        pcVar3 = _compare;
        sVar2 = RETURN_CALL_FLOW;
        SmallVector<wasm::Literal,_1UL>::SmallVector
                  ((SmallVector<wasm::Literal,_1UL> *)__return_storage_ptr__,
                   (SmallVector<wasm::Literal,_1UL> *)&target.breakTo.super_IString.str._M_str);
        (__return_storage_ptr__->breakTo).super_IString.str._M_len = sVar2;
        (__return_storage_ptr__->breakTo).super_IString.str._M_str = pcVar3;
        ::wasm::Literal::~Literal((Literal *)&stack0xffffffffffffff78);
      }
      else {
        pEVar1 = ((ModuleRunnerBase<wasm::ModuleRunner> *)local_48)->externalInterface;
        (*pEVar1->_vptr_ExternalInterface[5])
                  (&stack0xffffffffffffff78,pEVar1,info.instance,info.name.super_IString.str._M_len,
                   uVar5,(curr->heapType).id,arguments_00,
                   (curr->super_SpecificExpression<(wasm::Expression::Id)7>).super_Expression.type.
                   id,this);
        Flow::Flow(__return_storage_ptr__,(Literals *)&stack0xffffffffffffff78);
        SmallVector<wasm::Literal,_1UL>::~SmallVector
                  ((SmallVector<wasm::Literal,_1UL> *)&stack0xffffffffffffff78);
      }
    }
    else {
      Flow::Flow(__return_storage_ptr__,(Flow *)&flow.breakTo.super_IString.str._M_str);
    }
    SmallVector<wasm::Literal,_1UL>::~SmallVector
              ((SmallVector<wasm::Literal,_1UL> *)&flow.breakTo.super_IString.str._M_str);
  }
  else {
    Flow::Flow(__return_storage_ptr__,(Flow *)local_158);
  }
  SmallVector<wasm::Literal,_1UL>::~SmallVector((SmallVector<wasm::Literal,_1UL> *)local_158);
  SmallVector<wasm::Literal,_1UL>::~SmallVector
            ((SmallVector<wasm::Literal,_1UL> *)&target.breakTo.super_IString.str._M_str);
  return __return_storage_ptr__;
}

Assistant:

Flow visitCallIndirect(CallIndirect* curr) {
    NOTE_ENTER("CallIndirect");
    Literals arguments;
    Flow flow = self()->generateArguments(curr->operands, arguments);
    if (flow.breaking()) {
      return flow;
    }
    Flow target = self()->visit(curr->target);
    if (target.breaking()) {
      return target;
    }

    auto index = target.getSingleValue().getUnsigned();
    auto info = getTableInstanceInfo(curr->table);

    if (curr->isReturn) {
      // Return calls are represented by their arguments followed by a reference
      // to the function to be called.
      auto funcref = info.interface()->tableLoad(info.name, index);
      if (!Type::isSubType(funcref.type, Type(curr->heapType, NonNullable))) {
        trap("cast failure in call_indirect");
      }
      arguments.push_back(funcref);
      return Flow(RETURN_CALL_FLOW, std::move(arguments));
    }

    Flow ret = info.interface()->callTable(
      info.name, index, curr->heapType, arguments, curr->type, *self());
#ifdef WASM_INTERPRETER_DEBUG
    std::cout << "(returned to " << scope->function->name << ")\n";
#endif
    return ret;
  }